

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_t * ztast_create(ztast_mallocfn_t *mallocfn,ztast_freefn_t *freefn,void *opaque,
                      ztast_logfn_t *logfn)

{
  void *in_RDX;
  ztast_freefn_t *in_RSI;
  ztast_mallocfn_t *in_RDI;
  ztast_t *ast;
  ztast_t *local_8;
  
  local_8 = (ztast_t *)(*in_RDI)(0x20,in_RDX);
  if (local_8 == (ztast_t *)0x0) {
    local_8 = (ztast_t *)0x0;
  }
  else {
    local_8->program = (ztast_program_t *)0x0;
    local_8->mallocfn = in_RDI;
    local_8->freefn = in_RSI;
    local_8->opaque = in_RDX;
  }
  return local_8;
}

Assistant:

ztast_t *ztast_create(ztast_mallocfn_t  *mallocfn,
                      ztast_freefn_t    *freefn,
                      void              *opaque,
                      ztast_logfn_t     *logfn)
{
  ztast_t *ast;

  ast = mallocfn(sizeof(*ast), opaque);
  if (ast == NULL)
    return NULL;

  ast->program  = NULL;
  
  ast->mallocfn = mallocfn;
  ast->freefn   = freefn;
  ast->opaque   = opaque;

#ifdef ZTAST_LOG
  ast->logfn     = logfn;
#endif

  return ast;
}